

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O1

axbStatus_t axbMemBackendRegister(axbHandle_s *handle,axbMemBackend_s *mem)

{
  size_t sVar1;
  axbMemBackend_s **__ptr;
  axbMemBackend_s **ppaVar2;
  size_t sVar3;
  
  sVar1 = handle->memBackends_size;
  sVar3 = handle->memBackends_capacity;
  if (sVar1 == sVar3) {
    __ptr = handle->memBackends;
    handle->memBackends_capacity = sVar3 * 2;
    ppaVar2 = (axbMemBackend_s **)malloc(sVar3 << 4);
    handle->memBackends = ppaVar2;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        handle->memBackends[sVar3] = __ptr[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    free(__ptr);
  }
  sVar1 = handle->memBackends_size;
  handle->memBackends[sVar1] = mem;
  handle->memBackends_size = sVar1 + 1;
  return 0;
}

Assistant:

axbStatus_t axbMemBackendRegister(struct axbHandle_s *handle, struct axbMemBackend_s *mem)
{
  // check if there is still room for another backend. If not, resize array:
  if (handle->memBackends_size == handle->memBackends_capacity) {
    struct axbMemBackend_s **old_array = handle->memBackends;
    handle->memBackends_capacity *= 2;
    handle->memBackends = malloc(handle->memBackends_capacity * sizeof(struct axbMemBackend_s *));

    // copy over existing backends:
    for (size_t i=0; i<handle->memBackends_size; ++i) handle->memBackends[i] = old_array[i];
    free(old_array);
  }

  handle->memBackends[handle->memBackends_size] = mem;
  handle->memBackends_size += 1;
  return 0;
}